

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

char * private_RemoveWhiteSpace<false>(json_string *value_t,bool escapeQuotes,size_t *len)

{
  byte *pbVar1;
  size_type sVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  byte *end;
  byte *local_38;
  
  sVar2 = value_t->_M_string_length;
  pbVar3 = (byte *)malloc(sVar2 + 1);
  local_38 = (byte *)(value_t->_M_dataplus)._M_p;
  end = local_38 + sVar2;
  pbVar5 = pbVar3;
  for (; local_38 != end; local_38 = local_38 + 1) {
    bVar4 = *local_38;
    if (((1 < bVar4 - 9) && (bVar4 != 0xd)) && (bVar4 != 0x20)) {
      if (bVar4 == 0x22) {
        *pbVar5 = 0x22;
        do {
          pbVar5 = pbVar5 + 1;
          while( true ) {
            pbVar1 = local_38 + 1;
            bVar4 = local_38[1];
            if (bVar4 == 0x22) {
              bVar4 = 0x22;
              local_38 = pbVar1;
              goto LAB_0016bad9;
            }
            if (pbVar1 == end) goto LAB_0016bb04;
            if (bVar4 != 0x5c) break;
            *pbVar5 = 0x5c;
            bVar4 = local_38[2];
            if ((escapeQuotes) && (bVar4 == 0x22)) {
              used_ascii_one = true;
              bVar4 = 1;
            }
            pbVar5[1] = bVar4;
            pbVar5 = pbVar5 + 2;
            local_38 = local_38 + 2;
          }
          *pbVar5 = bVar4;
          local_38 = pbVar1;
        } while( true );
      }
      if (bVar4 == 0x23) {
LAB_0016bae7:
        SingleLineComment((char **)&local_38,(char *)end);
      }
      else if (bVar4 == 0x2f) {
        pbVar1 = local_38 + 1;
        if (*pbVar1 != 0x2a) {
          local_38 = local_38 + 1;
          if (*pbVar1 == 0x2f) goto LAB_0016bae7;
          break;
        }
        local_38 = local_38 + 3;
        while ((pbVar1 = local_38 + -1, local_38[-1] != 0x2a || (*local_38 != 0x2f))) {
          local_38 = local_38 + 1;
          if (pbVar1 == end) goto LAB_0016bb04;
        }
      }
      else {
        if ((byte)(bVar4 + 0x81) < 0xa1) break;
LAB_0016bad9:
        *pbVar5 = bVar4;
        pbVar5 = pbVar5 + 1;
      }
    }
  }
LAB_0016bb04:
  *len = (long)pbVar5 - (long)pbVar3;
  return (char *)pbVar3;
}

Assistant:

json_char * private_RemoveWhiteSpace(const json_string & value_t, bool escapeQuotes, size_t & len) json_nothrow {
#endif
	json_char * result;
	json_char * runner = result = json_malloc<json_char>(value_t.length() + 1);  //dealing with raw memory is faster than adding to a json_string
	JSON_ASSERT(result != 0, json_global(ERROR_OUT_OF_MEMORY));
	const json_char * const end = value_t.data() + value_t.length();
	for(const json_char * p = value_t.data(); p != end; ++p){
	  switch(*p){
		 case JSON_TEXT(' '):   //defined as white space
		 case JSON_TEXT('\t'):  //defined as white space
		 case JSON_TEXT('\n'):  //defined as white space
		 case JSON_TEXT('\r'):  //defined as white space
			break;
		#ifndef JSON_STRICT
			case JSON_TEXT('/'):  //a C comment
				if (*(++p) == JSON_TEXT('*')){  //a multiline comment
				   if (T) COMMENT_DELIMITER();
				   while ((*(++p) != JSON_TEXT('*')) || (*(p + 1) != JSON_TEXT('/'))){
					  if(p == end){
							COMMENT_DELIMITER(); 
							goto endofrunner;
						}
					  if (T) *runner++ = *p;
				   }
				   ++p;
				   if (T) COMMENT_DELIMITER();
				   break;
				}
				//Should be a single line C comment, so let it fall through to use the bash comment stripper
				JSON_ASSERT_SAFE(*p == JSON_TEXT('/'), JSON_TEXT("stray / character, not quoted, or a comment"), goto endofrunner;);
			case JSON_TEXT('#'):  //a bash comment
				if (T){
					SingleLineComment(p, end AND_RUNNER);
				} else {
					SingleLineComment(p, end);
				}
				break;
		 #endif
		 case JSON_TEXT('\"'):  //a quote
			*runner++ = JSON_TEXT('\"');
			while(*(++p) != JSON_TEXT('\"')){  //find the end of the quotation, as white space is preserved within it
				if(p == end) goto endofrunner;
				switch(*p){
				   case JSON_TEXT('\\'):
					  *runner++ = JSON_TEXT('\\');
					  if (escapeQuotes){
							*runner++ = (*++p == JSON_TEXT('\"')) ? ascii_one() : *p;  //an escaped quote will reak havoc will all of my searching functions, so change it into an illegal character in JSON for convertion later on
					  } else {
							*runner++ = *++p;
					  }
					  break;
				   default:
					  *runner++ = *p;
					  break;
				}
			}
			//no break, let it fall through so that the trailing quote gets added
		 default:
			JSON_ASSERT_SAFE((json_uchar)*p >= 32, JSON_TEXT("Invalid JSON character detected (lo)"), goto endofrunner;);
			JSON_ASSERT_SAFE((json_uchar)*p <= 126, JSON_TEXT("Invalid JSON character detected (hi)"), goto endofrunner;);
			*runner++ = *p;
			break;
	  }
	}
	endofrunner:
	len = runner - result;
	return result;
}